

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTableGen.cpp
# Opt level: O1

void __thiscall
SGParser::Generator::ParseTableGen::AllocateTables
          (ParseTableGen *this,size_t stateCount,size_t terminalCount,size_t nonTerminalCount)

{
  vector<unsigned_short_*,_std::allocator<unsigned_short_*>_> *pvVar1;
  pointer *pppuVar2;
  iterator iVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  unsigned_short *local_40;
  uint16_t *newActionTable;
  uint16_t *newGotoTable;
  
  ParseTable::FreeTables(&this->super_ParseTable);
  (this->super_ParseTable).ActionWidth = terminalCount;
  pvVar1 = &(this->super_ParseTable).ActionTable;
  std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::reserve(pvVar1,stateCount);
  lVar6 = (this->super_ParseTable).ActionWidth * stateCount;
  uVar5 = 0xffffffffffffffff;
  if (-1 < lVar6) {
    uVar5 = lVar6 * 2;
  }
  local_40 = (unsigned_short *)operator_new__(uVar5);
  if (lVar6 != 0) {
    memset(local_40,0,lVar6 * 2);
  }
  if (stateCount != 0) {
    sVar4 = stateCount;
    do {
      iVar3._M_current =
           (this->super_ParseTable).ActionTable.
           super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->super_ParseTable).ActionTable.
          super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short*,std::allocator<unsigned_short*>>::
        _M_realloc_insert<unsigned_short*const&>
                  ((vector<unsigned_short*,std::allocator<unsigned_short*>> *)pvVar1,iVar3,&local_40
                  );
      }
      else {
        *iVar3._M_current = local_40;
        pppuVar2 = &(this->super_ParseTable).ActionTable.
                    super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppuVar2 = *pppuVar2 + 1;
      }
      local_40 = local_40 + (this->super_ParseTable).ActionWidth;
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
  }
  (this->super_ParseTable).GotoWidth = nonTerminalCount;
  pvVar1 = &(this->super_ParseTable).GotoTable;
  std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::reserve(pvVar1,stateCount);
  lVar6 = (this->super_ParseTable).GotoWidth * stateCount;
  uVar5 = 0xffffffffffffffff;
  if (-1 < lVar6) {
    uVar5 = lVar6 * 2;
  }
  newActionTable = (uint16_t *)operator_new__(uVar5);
  if (lVar6 != 0) {
    memset(newActionTable,0xff,lVar6 * 2);
  }
  if (stateCount != 0) {
    do {
      iVar3._M_current =
           (this->super_ParseTable).GotoTable.
           super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->super_ParseTable).GotoTable.
          super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short*,std::allocator<unsigned_short*>>::
        _M_realloc_insert<unsigned_short*const&>
                  ((vector<unsigned_short*,std::allocator<unsigned_short*>> *)pvVar1,iVar3,
                   &newActionTable);
      }
      else {
        *iVar3._M_current = newActionTable;
        pppuVar2 = &(this->super_ParseTable).GotoTable.
                    super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppuVar2 = *pppuVar2 + 1;
      }
      newActionTable = newActionTable + (this->super_ParseTable).GotoWidth;
      stateCount = stateCount - 1;
    } while (stateCount != 0);
  }
  return;
}

Assistant:

void ParseTableGen::AllocateTables(size_t stateCount, size_t terminalCount,
                                   size_t nonTerminalCount) {
    FreeTables();

    // *** Allocate memory for the action table

    ActionWidth = terminalCount;
    ActionTable.reserve(stateCount);

    const auto newActionSize  = stateCount * ActionWidth;
    auto       newActionTable = new uint16_t[newActionSize];
    std::fill(newActionTable, newActionTable + newActionSize, uint16_t(0u));

    for (size_t i = 0u; i < stateCount; ++i, newActionTable += ActionWidth)
        ActionTable.push_back(newActionTable);

    // *** Allocate memory for the goto table

    GotoWidth = nonTerminalCount;
    GotoTable.reserve(stateCount);

    const auto newGotoSize  = stateCount * GotoWidth;
    auto       newGotoTable = new uint16_t[newGotoSize];
    std::fill(newGotoTable, newGotoTable + newGotoSize, EmptyGoto);

    for (size_t i = 0u; i < stateCount; ++i, newGotoTable += GotoWidth)
        GotoTable.push_back(newGotoTable);
}